

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O2

uint16_t lha_crc16(uint16_t crc,void *pp,size_t len)

{
  byte *pbVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte *pbVar6;
  byte *pbVar7;
  byte bVar8;
  uchar *buff;
  
  do {
    switch(len) {
    case 0:
      return crc;
    case 7:
      bVar8 = *pp;
      pp = (void *)((long)pp + 1);
      crc = crc >> 8 ^ crc16tbl[(byte)(bVar8 ^ (byte)crc)];
    case 6:
      bVar8 = *pp;
      pp = (void *)((long)pp + 1);
      crc = crc >> 8 ^ crc16tbl[(byte)(bVar8 ^ (byte)crc)];
    case 5:
      bVar8 = *pp;
      pp = (void *)((long)pp + 1);
      crc = crc >> 8 ^ crc16tbl[(byte)(bVar8 ^ (byte)crc)];
    case 4:
      bVar8 = *pp;
      pp = (void *)((long)pp + 1);
      crc = crc >> 8 ^ crc16tbl[(byte)(bVar8 ^ (byte)crc)];
    case 3:
      bVar8 = *pp;
      pp = (void *)((long)pp + 1);
      crc = crc >> 8 ^ crc16tbl[(byte)(bVar8 ^ (byte)crc)];
    case 2:
      bVar8 = *pp;
      pp = (void *)((long)pp + 1);
      crc = crc >> 8 ^ crc16tbl[(byte)(bVar8 ^ (byte)crc)];
    case 1:
      return crc >> 8 ^ crc16tbl[(byte)(*pp ^ (byte)crc)];
    default:
      bVar8 = *pp;
      pbVar1 = (byte *)((long)pp + 1);
      pbVar2 = (byte *)((long)pp + 2);
      pbVar3 = (byte *)((long)pp + 3);
      pbVar4 = (byte *)((long)pp + 4);
      pbVar5 = (byte *)((long)pp + 5);
      pbVar6 = (byte *)((long)pp + 6);
      pbVar7 = (byte *)((long)pp + 7);
      pp = (void *)((long)pp + 8);
      crc = crc16tbl[(byte)((byte)(crc16tbl[(byte)((byte)(crc16tbl[(byte)((byte)(crc16tbl[(byte)(
                                                  bVar8 ^ (byte)crc)] >> 8) ^
                                                  (byte)crc16tbl[(byte)((byte)(crc >> 8) ^
                                                                        (byte)crc16tbl[(byte)(bVar8 
                                                  ^ (byte)crc)] ^ *pbVar1)] ^ *pbVar2)] >> 8) ^
                                                  (byte)crc16tbl[(byte)((byte)(crc16tbl[(byte)((byte
                                                  )(crc >> 8) ^
                                                  (byte)crc16tbl[(byte)(bVar8 ^ (byte)crc)] ^
                                                  *pbVar1)] >> 8) ^
                                                  (byte)crc16tbl[(byte)((byte)(crc16tbl[(byte)(bVar8
                                                                                              ^ (
                                                  byte)crc)] >> 8) ^
                                                  (byte)crc16tbl[(byte)((byte)(crc >> 8) ^
                                                                        (byte)crc16tbl[(byte)(bVar8 
                                                  ^ (byte)crc)] ^ *pbVar1)] ^ *pbVar2)] ^ *pbVar3)]
                                                  ^ *pbVar4)] >> 8) ^
                            (byte)crc16tbl[(byte)((byte)(crc16tbl[(byte)((byte)(crc16tbl[(byte)((
                                                  byte)(crc >> 8) ^
                                                  (byte)crc16tbl[(byte)(bVar8 ^ (byte)crc)] ^
                                                  *pbVar1)] >> 8) ^
                                                  (byte)crc16tbl[(byte)((byte)(crc16tbl[(byte)(bVar8
                                                                                              ^ (
                                                  byte)crc)] >> 8) ^
                                                  (byte)crc16tbl[(byte)((byte)(crc >> 8) ^
                                                                        (byte)crc16tbl[(byte)(bVar8 
                                                  ^ (byte)crc)] ^ *pbVar1)] ^ *pbVar2)] ^ *pbVar3)]
                                                  >> 8) ^ (byte)crc16tbl[(byte)((byte)(crc16tbl[(
                                                  byte)((byte)(crc16tbl[(byte)(bVar8 ^ (byte)crc)]
                                                              >> 8) ^
                                                        (byte)crc16tbl[(byte)((byte)(crc >> 8) ^
                                                                              (byte)crc16tbl[(byte)(
                                                  bVar8 ^ (byte)crc)] ^ *pbVar1)] ^ *pbVar2)] >> 8)
                                                  ^ (byte)crc16tbl[(byte)((byte)(crc16tbl[(byte)((
                                                  byte)(crc >> 8) ^
                                                  (byte)crc16tbl[(byte)(bVar8 ^ (byte)crc)] ^
                                                  *pbVar1)] >> 8) ^
                                                  (byte)crc16tbl[(byte)((byte)(crc16tbl[(byte)(bVar8
                                                                                              ^ (
                                                  byte)crc)] >> 8) ^
                                                  (byte)crc16tbl[(byte)((byte)(crc >> 8) ^
                                                                        (byte)crc16tbl[(byte)(bVar8 
                                                  ^ (byte)crc)] ^ *pbVar1)] ^ *pbVar2)] ^ *pbVar3)]
                                                  ^ *pbVar4)] ^ *pbVar5)] ^ *pbVar6)] >> 8 ^
            crc16tbl[(byte)((byte)(crc16tbl[(byte)((byte)(crc16tbl[(byte)((byte)(crc16tbl[(byte)((
                                                  byte)(crc >> 8) ^
                                                  (byte)crc16tbl[(byte)(bVar8 ^ (byte)crc)] ^
                                                  *pbVar1)] >> 8) ^
                                                  (byte)crc16tbl[(byte)((byte)(crc16tbl[(byte)(bVar8
                                                                                              ^ (
                                                  byte)crc)] >> 8) ^
                                                  (byte)crc16tbl[(byte)((byte)(crc >> 8) ^
                                                                        (byte)crc16tbl[(byte)(bVar8 
                                                  ^ (byte)crc)] ^ *pbVar1)] ^ *pbVar2)] ^ *pbVar3)]
                                                  >> 8) ^ (byte)crc16tbl[(byte)((byte)(crc16tbl[(
                                                  byte)((byte)(crc16tbl[(byte)(bVar8 ^ (byte)crc)]
                                                              >> 8) ^
                                                        (byte)crc16tbl[(byte)((byte)(crc >> 8) ^
                                                                              (byte)crc16tbl[(byte)(
                                                  bVar8 ^ (byte)crc)] ^ *pbVar1)] ^ *pbVar2)] >> 8)
                                                  ^ (byte)crc16tbl[(byte)((byte)(crc16tbl[(byte)((
                                                  byte)(crc >> 8) ^
                                                  (byte)crc16tbl[(byte)(bVar8 ^ (byte)crc)] ^
                                                  *pbVar1)] >> 8) ^
                                                  (byte)crc16tbl[(byte)((byte)(crc16tbl[(byte)(bVar8
                                                                                              ^ (
                                                  byte)crc)] >> 8) ^
                                                  (byte)crc16tbl[(byte)((byte)(crc >> 8) ^
                                                                        (byte)crc16tbl[(byte)(bVar8 
                                                  ^ (byte)crc)] ^ *pbVar1)] ^ *pbVar2)] ^ *pbVar3)]
                                                  ^ *pbVar4)] ^ *pbVar5)] >> 8) ^
                            (byte)crc16tbl[(byte)((byte)(crc16tbl[(byte)((byte)(crc16tbl[(byte)((
                                                  byte)(crc16tbl[(byte)(bVar8 ^ (byte)crc)] >> 8) ^
                                                  (byte)crc16tbl[(byte)((byte)(crc >> 8) ^
                                                                        (byte)crc16tbl[(byte)(bVar8 
                                                  ^ (byte)crc)] ^ *pbVar1)] ^ *pbVar2)] >> 8) ^
                                                  (byte)crc16tbl[(byte)((byte)(crc16tbl[(byte)((byte
                                                  )(crc >> 8) ^
                                                  (byte)crc16tbl[(byte)(bVar8 ^ (byte)crc)] ^
                                                  *pbVar1)] >> 8) ^
                                                  (byte)crc16tbl[(byte)((byte)(crc16tbl[(byte)(bVar8
                                                                                              ^ (
                                                  byte)crc)] >> 8) ^
                                                  (byte)crc16tbl[(byte)((byte)(crc >> 8) ^
                                                                        (byte)crc16tbl[(byte)(bVar8 
                                                  ^ (byte)crc)] ^ *pbVar1)] ^ *pbVar2)] ^ *pbVar3)]
                                                  ^ *pbVar4)] >> 8) ^
                                                  (byte)crc16tbl[(byte)((byte)(crc16tbl[(byte)((byte
                                                  )(crc16tbl[(byte)((byte)(crc >> 8) ^
                                                                    (byte)crc16tbl[(byte)(bVar8 ^ (
                                                  byte)crc)] ^ *pbVar1)] >> 8) ^
                                                  (byte)crc16tbl[(byte)((byte)(crc16tbl[(byte)(bVar8
                                                                                              ^ (
                                                  byte)crc)] >> 8) ^
                                                  (byte)crc16tbl[(byte)((byte)(crc >> 8) ^
                                                                        (byte)crc16tbl[(byte)(bVar8 
                                                  ^ (byte)crc)] ^ *pbVar1)] ^ *pbVar2)] ^ *pbVar3)]
                                                  >> 8) ^ (byte)crc16tbl[(byte)((byte)(crc16tbl[(
                                                  byte)((byte)(crc16tbl[(byte)(bVar8 ^ (byte)crc)]
                                                              >> 8) ^
                                                        (byte)crc16tbl[(byte)((byte)(crc >> 8) ^
                                                                              (byte)crc16tbl[(byte)(
                                                  bVar8 ^ (byte)crc)] ^ *pbVar1)] ^ *pbVar2)] >> 8)
                                                  ^ (byte)crc16tbl[(byte)((byte)(crc16tbl[(byte)((
                                                  byte)(crc >> 8) ^
                                                  (byte)crc16tbl[(byte)(bVar8 ^ (byte)crc)] ^
                                                  *pbVar1)] >> 8) ^
                                                  (byte)crc16tbl[(byte)((byte)(crc16tbl[(byte)(bVar8
                                                                                              ^ (
                                                  byte)crc)] >> 8) ^
                                                  (byte)crc16tbl[(byte)((byte)(crc >> 8) ^
                                                                        (byte)crc16tbl[(byte)(bVar8 
                                                  ^ (byte)crc)] ^ *pbVar1)] ^ *pbVar2)] ^ *pbVar3)]
                                                  ^ *pbVar4)] ^ *pbVar5)] ^ *pbVar6)] ^ *pbVar7)];
      len = len - 8;
    }
  } while( true );
}

Assistant:

static uint16_t
lha_crc16(uint16_t crc, const void *pp, size_t len)
{
	const unsigned char *buff = (const unsigned char *)pp;

	while (len >= 8) {
		CRC16(crc, *buff++); CRC16(crc, *buff++);
		CRC16(crc, *buff++); CRC16(crc, *buff++);
		CRC16(crc, *buff++); CRC16(crc, *buff++);
		CRC16(crc, *buff++); CRC16(crc, *buff++);
		len -= 8;
	}
	switch (len) {
	case 7:
		CRC16(crc, *buff++);
		/* FALL THROUGH */
	case 6:
		CRC16(crc, *buff++);
		/* FALL THROUGH */
	case 5:
		CRC16(crc, *buff++);
		/* FALL THROUGH */
	case 4:
		CRC16(crc, *buff++);
		/* FALL THROUGH */
	case 3:
		CRC16(crc, *buff++);
		/* FALL THROUGH */
	case 2:
		CRC16(crc, *buff++);
		/* FALL THROUGH */
	case 1:
		CRC16(crc, *buff);
		/* FALL THROUGH */
	case 0:
		break;
	}
	return (crc);
}